

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpull.c
# Opt level: O3

void nn_xpull_rm(nn_sockbase *self,nn_pipe *pipe)

{
  nn_fq_data *data;
  
  data = (nn_fq_data *)nn_pipe_getdata(pipe);
  nn_fq_rm((nn_fq *)(self + 1),data);
  nn_free(data);
  return;
}

Assistant:

static void nn_xpull_rm (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xpull *xpull;
    struct nn_xpull_data *data;

    xpull = nn_cont (self, struct nn_xpull, sockbase);
    data = nn_pipe_getdata (pipe);
    nn_fq_rm (&xpull->fq, &data->fq);
    nn_free (data);
}